

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O3

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::TPZGeoBlend
          (TPZGeoBlend<pzgeom::TPZGeoCube> *this,TPZGeoBlend<pzgeom::TPZGeoCube> *cp,
          TPZGeoMesh *destmesh)

{
  int64_t iVar1;
  TPZGeoEl *pTVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  int64_t iVar8;
  long lVar9;
  TPZGeoEl **ppTVar10;
  TPZTransform<double> *t;
  TPZTransform<double> *this_00;
  
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_01892810;
  iVar1 = (cp->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[1];
  iVar3 = (cp->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[2];
  iVar4 = (cp->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[3];
  iVar5 = (cp->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[4];
  iVar6 = (cp->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[5];
  iVar7 = (cp->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[6];
  iVar8 = (cp->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[7];
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[0] =
       (cp->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[0];
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[1] = iVar1;
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[2] = iVar3;
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[3] = iVar4;
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[4] = iVar5;
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[5] = iVar6;
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[6] = iVar7;
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.fNodeIndexes[7] = iVar8;
  (this->super_TPZGeoCube).super_TPZNodeRep<8,_pztopology::TPZCube>.super_TPZCube.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZGeoBlend_0188e9a8;
  lVar9 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar9) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar9) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar9) = 0xffffffffffffffff;
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0x1e0);
  this_00 = (TPZTransform<double> *)&this->field_0x230;
  lVar9 = 0;
  do {
    TPZTransform<double>::TPZTransform((TPZTransform<double> *)((long)this_00 + lVar9));
    lVar9 = lVar9 + 0x1a0;
  } while (lVar9 != 0x2080);
  iVar1 = cp->fGeoEl->fIndex;
  t = (TPZTransform<double> *)&cp->field_0x230;
  lVar9 = 0;
  do {
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar9) =
         *(undefined8 *)((long)&cp->fNeighbours[0].fGeoElIndex + lVar9);
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar9) =
         *(undefined4 *)((long)&cp->fNeighbours[0].fSide + lVar9);
    TPZTransform<double>::operator=(this_00,t);
    lVar9 = lVar9 + 0x18;
    t = t + 1;
    this_00 = this_00 + 1;
  } while (lVar9 != 0x1e0);
  ppTVar10 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                       (&(destmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,iVar1);
  pTVar2 = *ppTVar10;
  this->fGeoEl = pTVar2;
  if (pTVar2 == (TPZGeoEl *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Geom/tpzgeoblend.cpp"
               ,0x1d);
  }
  return;
}

Assistant:

pzgeom::TPZGeoBlend<TGeo>::TPZGeoBlend(const TPZGeoBlend<TGeo> &cp, TPZGeoMesh &destmesh) : TPZRegisterClassId(&TPZGeoBlend<TGeo>::ClassId), TGeo(cp,destmesh)
{
    int64_t gelindex = cp.fGeoEl->Index();
    for (int is = 0; is < 1 + TGeo::NSides - TGeo::NNodes; is++) {
        fNeighbours[is] =  cp.fNeighbours[is];
        fTrans[is] =  cp.fTrans[is];
    }
    fGeoEl = destmesh.Element(gelindex);
    if(!fGeoEl) DebugStop();
}